

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphCG.cpp
# Opt level: O0

void __thiscall phaeton::GraphCodeGen::GraphCodeGen(GraphCodeGen *this,Sema *S,string *FuncName)

{
  string *FuncName_local;
  Sema *S_local;
  GraphCodeGen *this_local;
  
  CodeGen::CodeGen(&this->super_CodeGen,S,FuncName);
  (this->super_CodeGen).super_ASTVisitor._vptr_ASTVisitor = (_func_int **)&PTR_visitProgram_001f8fc8
  ;
  this->CurrentGraph = (GraphCGGraph *)0x0;
  std::
  vector<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>,_std::allocator<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>_>_>
  ::vector(&this->CurrentLegs);
  this->CurrentEnd = (GraphCGNode *)0x0;
  std::
  set<const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_std::less<const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>,_std::allocator<const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>
  ::set(&this->Graphs);
  std::
  map<const_phaeton::Expression_*,_const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_std::less<const_phaeton::Expression_*>,_std::allocator<std::pair<const_phaeton::Expression_*const,_const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>_>
  ::map(&this->ExprGraphs);
  std::
  vector<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>,_std::allocator<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>_>_>
  ::clear(&this->CurrentLegs);
  return;
}

Assistant:

GraphCodeGen::GraphCodeGen(const Sema *S, const std::string &FuncName)
    : CodeGen(S, FuncName), CurrentGraph(nullptr), CurrentEnd(nullptr) {
  CurrentLegs.clear();
}